

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O2

int OPENSSL_strncasecmp(char *a,char *b,size_t n)

{
  uint uVar1;
  size_t i;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  
  sVar2 = 0;
  do {
    if (n == sVar2) {
      return 0;
    }
    uVar3 = (uint)a[sVar2];
    uVar1 = uVar3 | 0x20;
    if (0x19 < uVar3 - 0x41) {
      uVar1 = uVar3;
    }
    uVar4 = (uint)b[sVar2];
    uVar3 = uVar4 | 0x20;
    if (0x19 < uVar4 - 0x41) {
      uVar3 = uVar4;
    }
    if ((int)uVar1 < (int)uVar3) {
      return -1;
    }
    if ((int)uVar3 < (int)uVar1) {
      return 1;
    }
    sVar2 = sVar2 + 1;
  } while (uVar1 != 0);
  return 0;
}

Assistant:

int OPENSSL_strncasecmp(const char *a, const char *b, size_t n) {
  for (size_t i = 0; i < n; i++) {
    const int aa = OPENSSL_tolower(a[i]);
    const int bb = OPENSSL_tolower(b[i]);

    if (aa < bb) {
      return -1;
    } else if (aa > bb) {
      return 1;
    } else if (aa == 0) {
      return 0;
    }
  }

  return 0;
}